

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_codestream_info_v2_t * j2k_get_cstr_info(opj_j2k_t *p_j2k)

{
  void *pvVar1;
  opj_tccp_info_t *poVar2;
  long lVar3;
  int local_4c;
  int local_44;
  OPJ_INT32 numbands;
  OPJ_INT32 bandno;
  opj_tccp_info_t *l_tccp_info;
  opj_tccp_t *l_tccp;
  opj_codestream_info_v2_t *cstr_info;
  opj_tcp_t *l_default_tile;
  OPJ_UINT32 numcomps;
  OPJ_UINT32 compno;
  opj_j2k_t *p_j2k_local;
  
  l_default_tile._0_4_ = p_j2k->m_private_image->numcomps;
  _numcomps = p_j2k;
  l_tccp = (opj_tccp_t *)opj_calloc(1,0x48);
  if (l_tccp == (opj_tccp_t *)0x0) {
    p_j2k_local = (opj_j2k_t *)0x0;
  }
  else {
    l_tccp->qntsty = _numcomps->m_private_image->numcomps;
    l_tccp->csty = (_numcomps->m_cp).tx0;
    l_tccp->numresolutions = (_numcomps->m_cp).ty0;
    l_tccp->cblkw = (_numcomps->m_cp).tdx;
    l_tccp->cblkh = (_numcomps->m_cp).tdy;
    l_tccp->cblksty = (_numcomps->m_cp).tw;
    l_tccp->qmfbid = (_numcomps->m_cp).th;
    *(undefined8 *)&l_tccp->stepsizes[4].mant = 0;
    cstr_info = (opj_codestream_info_v2_t *)(_numcomps->m_specific_param).m_decoder.m_default_tcp;
    l_tccp->stepsizes[1].expn = ((opj_tcp_t *)cstr_info)->csty;
    l_tccp->stepsizes[1].mant = ((opj_tcp_t *)cstr_info)->prg;
    l_tccp->stepsizes[2].expn = ((opj_tcp_t *)cstr_info)->numlayers;
    l_tccp->stepsizes[2].mant = ((opj_tcp_t *)cstr_info)->mct;
    pvVar1 = opj_calloc((ulong)l_tccp->qntsty,0x438);
    *(void **)&l_tccp->stepsizes[3].mant = pvVar1;
    if (*(long *)&l_tccp->stepsizes[3].mant == 0) {
      opj_destroy_cstr_info((opj_codestream_info_v2_t **)&l_tccp);
      p_j2k_local = (opj_j2k_t *)0x0;
    }
    else {
      for (l_default_tile._4_4_ = 0; l_default_tile._4_4_ < (OPJ_UINT32)l_default_tile;
          l_default_tile._4_4_ = l_default_tile._4_4_ + 1) {
        poVar2 = cstr_info[0x4d].m_default_tile_info.tccp_info + l_default_tile._4_4_;
        lVar3 = *(long *)&l_tccp->stepsizes[3].mant + (ulong)l_default_tile._4_4_ * 0x438;
        *(OPJ_UINT32 *)(lVar3 + 4) = poVar2->compno;
        *(OPJ_UINT32 *)(lVar3 + 8) = poVar2->csty;
        *(OPJ_UINT32 *)(lVar3 + 0xc) = poVar2->numresolutions;
        *(OPJ_UINT32 *)(lVar3 + 0x10) = poVar2->cblkw;
        *(OPJ_UINT32 *)(lVar3 + 0x14) = poVar2->cblkh;
        *(OPJ_UINT32 *)(lVar3 + 0x18) = poVar2->cblksty;
        if (poVar2->csty < 0x21) {
          memcpy((void *)(lVar3 + 0x3b4),poVar2->prcw + 0x20,(ulong)poVar2->csty);
          memcpy((void *)(lVar3 + 0x330),&poVar2->roishift,(ulong)poVar2->csty);
        }
        *(OPJ_UINT32 *)(lVar3 + 0x1c) = poVar2->qmfbid;
        *(OPJ_UINT32 *)(lVar3 + 0x328) = poVar2->stepsizes_expn[0x60];
        if (poVar2->qmfbid == 1) {
          local_4c = 1;
        }
        else {
          local_4c = poVar2->csty * 3 + -2;
        }
        if (local_4c < 0x61) {
          for (local_44 = 0; local_44 < local_4c; local_44 = local_44 + 1) {
            *(OPJ_UINT32 *)(lVar3 + 0x20 + (long)local_44 * 4) =
                 poVar2->stepsizes_mant[(long)local_44 * 2];
            *(OPJ_UINT32 *)(lVar3 + 0x1a4 + (long)local_44 * 4) =
                 poVar2->stepsizes_mant[(long)local_44 * 2 + -1];
          }
        }
        *(OPJ_UINT32 *)(lVar3 + 0x32c) = poVar2->numgbits;
      }
      p_j2k_local = (opj_j2k_t *)l_tccp;
    }
  }
  return (opj_codestream_info_v2_t *)p_j2k_local;
}

Assistant:

opj_codestream_info_v2_t* j2k_get_cstr_info(opj_j2k_t* p_j2k)
{
        OPJ_UINT32 compno;
        OPJ_UINT32 numcomps = p_j2k->m_private_image->numcomps;
        opj_tcp_t *l_default_tile;
        opj_codestream_info_v2_t* cstr_info = (opj_codestream_info_v2_t*) opj_calloc(1,sizeof(opj_codestream_info_v2_t));
		if (!cstr_info)
			return NULL;

        cstr_info->nbcomps = p_j2k->m_private_image->numcomps;

        cstr_info->tx0 = p_j2k->m_cp.tx0;
        cstr_info->ty0 = p_j2k->m_cp.ty0;
        cstr_info->tdx = p_j2k->m_cp.tdx;
        cstr_info->tdy = p_j2k->m_cp.tdy;
        cstr_info->tw = p_j2k->m_cp.tw;
        cstr_info->th = p_j2k->m_cp.th;

        cstr_info->tile_info = NULL; /* Not fill from the main header*/

        l_default_tile = p_j2k->m_specific_param.m_decoder.m_default_tcp;

        cstr_info->m_default_tile_info.csty = l_default_tile->csty;
        cstr_info->m_default_tile_info.prg = l_default_tile->prg;
        cstr_info->m_default_tile_info.numlayers = l_default_tile->numlayers;
        cstr_info->m_default_tile_info.mct = l_default_tile->mct;

        cstr_info->m_default_tile_info.tccp_info = (opj_tccp_info_t*) opj_calloc(cstr_info->nbcomps, sizeof(opj_tccp_info_t));
		if (!cstr_info->m_default_tile_info.tccp_info)
		{
			opj_destroy_cstr_info(&cstr_info);
			return NULL;
		}

        for (compno = 0; compno < numcomps; compno++) {
                opj_tccp_t *l_tccp = &(l_default_tile->tccps[compno]);
                opj_tccp_info_t *l_tccp_info = &(cstr_info->m_default_tile_info.tccp_info[compno]);
                OPJ_INT32 bandno, numbands;

                /* coding style*/
                l_tccp_info->csty = l_tccp->csty;
                l_tccp_info->numresolutions = l_tccp->numresolutions;
                l_tccp_info->cblkw = l_tccp->cblkw;
                l_tccp_info->cblkh = l_tccp->cblkh;
                l_tccp_info->cblksty = l_tccp->cblksty;
                l_tccp_info->qmfbid = l_tccp->qmfbid;
                if (l_tccp->numresolutions < OPJ_J2K_MAXRLVLS)
                {
                        memcpy(l_tccp_info->prch, l_tccp->prch, l_tccp->numresolutions);
                        memcpy(l_tccp_info->prcw, l_tccp->prcw, l_tccp->numresolutions);
                }

                /* quantization style*/
                l_tccp_info->qntsty = l_tccp->qntsty;
                l_tccp_info->numgbits = l_tccp->numgbits;

                numbands = (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) ? 1 : (OPJ_INT32)l_tccp->numresolutions * 3 - 2;
                if (numbands < OPJ_J2K_MAXBANDS) {
                        for (bandno = 0; bandno < numbands; bandno++) {
                                l_tccp_info->stepsizes_mant[bandno] = (OPJ_UINT32)l_tccp->stepsizes[bandno].mant;
                                l_tccp_info->stepsizes_expn[bandno] = (OPJ_UINT32)l_tccp->stepsizes[bandno].expn;
                        }
                }

                /* RGN value*/
                l_tccp_info->roishift = l_tccp->roishift;
        }

        return cstr_info;
}